

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O0

int solve(SatPos *SatposSolver,SPP *SppSolver,ReadData *decoder,ELLIPSOID type,string *path)

{
  BLH blh;
  XYZ Ref;
  XYZ xyz;
  ELLIPSOID type_00;
  ELLIPSOID type_01;
  ELLIPSOID ellipsoid;
  long lVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  undefined1 *__dest;
  byte bVar4;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  bool local_aacd;
  string local_aac0 [32];
  undefined8 local_aaa0 [599];
  double local_97e8;
  double dStack_97e0;
  double local_97d8;
  SPPResult local_97d0;
  double local_8518;
  double dStack_8510;
  double local_8508;
  double dStack_8500;
  double local_84f8;
  double dStack_84f0;
  Ephemeris *local_84e0;
  Ephemeris *local_84d8;
  Obs *local_84d0;
  Obs *local_84c8;
  Satellite *local_84c0;
  Satellite *local_84b8;
  SPPResult local_84b0;
  undefined8 local_71f8;
  undefined8 uStack_71f0;
  undefined8 local_71e8;
  undefined8 uStack_71e0;
  undefined8 local_71d8;
  double dStack_71d0;
  Ephemeris *local_71c8;
  Ephemeris *local_71c0;
  Obs *local_71b8;
  Obs *local_71b0;
  Satellite *local_71a8;
  Satellite *local_71a0;
  double local_7198;
  double dt1;
  undefined8 local_5ed8;
  undefined8 uStack_5ed0;
  undefined8 local_5ec8;
  undefined8 uStack_5ec0;
  undefined8 local_5eb8;
  double dStack_5eb0;
  Ephemeris *local_5ea8;
  Ephemeris *local_5ea0;
  Obs *local_5e98;
  Obs *local_5e90;
  Satellite *local_5e88;
  Satellite *local_5e80;
  undefined8 local_5e78 [599];
  Ephemeris *local_4bc0;
  undefined8 local_4bb8 [599];
  Obs *local_3900;
  Ephemeris *local_38f8;
  undefined8 local_38f0 [599];
  Ephemeris *local_2638;
  undefined8 local_2630 [599];
  Obs *local_1378;
  Ephemeris *local_1370;
  int local_1368;
  int local_1364;
  int flag;
  int count;
  double dt0;
  double local_1350;
  double local_1348;
  undefined8 local_1340;
  undefined8 uStack_1338;
  undefined8 local_1330;
  undefined8 uStack_1328;
  undefined8 local_1320;
  double dStack_1318;
  BLH local_1310;
  BLH local_12f8;
  undefined1 local_12e0 [8];
  SPPResult result;
  string *path_local;
  ReadData *decoder_local;
  SPP *SppSolver_local;
  SatPos *SatposSolver_local;
  
  bVar4 = 0;
  result.PDop = (double)path;
  SPP::GetResult((SPPResult *)local_12e0,SppSolver);
  local_aacd = false;
  if ((result.UserPositionBLH.H == -1.0) && (!NAN(result.UserPositionBLH.H))) {
    ReadData::GetUserPos(&local_12f8,decoder);
    local_aacd = local_12f8.H != 0.0;
  }
  if (local_aacd) {
    ReadData::GetUserPos(&local_1310,decoder);
    memcpy(&local_1340,&type,0x30);
    blh.L = local_1310.L;
    blh.B = local_1310.B;
    blh.H = local_1310.H;
    ellipsoid.b = (double)uStack_1338;
    ellipsoid.a = (double)local_1340;
    ellipsoid.c = (double)local_1330;
    ellipsoid.alpha = (double)uStack_1328;
    ellipsoid.e2 = (double)local_1320;
    ellipsoid.e1_2 = dStack_1318;
    BLH2XYZ(blh,ellipsoid,(XYZ *)&result.UserPositionBLH.H);
    dt0 = result.UserPositionBLH.H;
    local_1350 = result.UserRefPositionXYZ.X;
    local_1348 = result.UserRefPositionXYZ.Y;
    Ref.Y = result.UserRefPositionXYZ.X;
    Ref.X = result.UserPositionBLH.H;
    Ref.Z = result.UserRefPositionXYZ.Y;
    SPP::setRefPos(SppSolver,Ref);
  }
  _flag = (double)result._2440_8_ + result.GPSR;
  for (local_1364 = 0; local_1364 < 10; local_1364 = local_1364 + 1) {
    local_1370 = ReadData::GetGPSEph(decoder);
    local_1378 = ReadData::GetGPSObs(decoder);
    memcpy(local_2630,local_12e0,0x12b8);
    puVar2 = local_2630;
    puVar3 = (undefined8 *)&stack0xffffffffffff4208;
    for (lVar1 = 599; lVar1 != 0; lVar1 = lVar1 + -1) {
      *puVar3 = *puVar2;
      puVar2 = puVar2 + (ulong)bVar4 * -2 + 1;
      puVar3 = puVar3 + (ulong)bVar4 * -2 + 1;
    }
    local_1368 = SatPos::CalculateGPSPos(SatposSolver,&local_1370,&local_1378);
    if (local_1368 != 0) break;
    local_2638 = ReadData::GetGPSEph(decoder);
    memcpy(local_38f0,local_12e0,0x12b8);
    puVar2 = local_38f0;
    puVar3 = (undefined8 *)&stack0xffffffffffff4208;
    for (lVar1 = 599; lVar1 != 0; lVar1 = lVar1 + -1) {
      *puVar3 = *puVar2;
      puVar2 = puVar2 + (ulong)bVar4 * -2 + 1;
      puVar3 = puVar3 + (ulong)bVar4 * -2 + 1;
    }
    local_1368 = SatPos::CalculateSatVel(SatposSolver,&local_2638,0);
    if (local_1368 != 0) break;
    local_38f8 = ReadData::GetBDSEph(decoder);
    local_3900 = ReadData::GetBDSObs(decoder);
    memcpy(local_4bb8,local_12e0,0x12b8);
    puVar2 = local_4bb8;
    puVar3 = (undefined8 *)&stack0xffffffffffff4208;
    for (lVar1 = 599; lVar1 != 0; lVar1 = lVar1 + -1) {
      *puVar3 = *puVar2;
      puVar2 = puVar2 + (ulong)bVar4 * -2 + 1;
      puVar3 = puVar3 + (ulong)bVar4 * -2 + 1;
    }
    local_1368 = SatPos::CalculateBDSPos(SatposSolver,&local_38f8,&local_3900);
    if (local_1368 != 0) break;
    local_4bc0 = ReadData::GetBDSEph(decoder);
    memcpy(local_5e78,local_12e0,0x12b8);
    puVar2 = local_5e78;
    puVar3 = (undefined8 *)&stack0xffffffffffff4208;
    for (lVar1 = 599; lVar1 != 0; lVar1 = lVar1 + -1) {
      *puVar3 = *puVar2;
      puVar2 = puVar2 + (ulong)bVar4 * -2 + 1;
      puVar3 = puVar3 + (ulong)bVar4 * -2 + 1;
    }
    local_1368 = SatPos::CalculateSatVel(SatposSolver,&local_4bc0,4);
    if (local_1368 != 0) break;
    local_5e80 = SatPos::GetPosAndVel(SatposSolver,GPS);
    local_5e88 = SatPos::GetPosAndVel(SatposSolver,BDS);
    local_5e90 = ReadData::GetGPSObs(decoder);
    local_5e98 = ReadData::GetBDSObs(decoder);
    local_5ea0 = ReadData::GetGPSEph(decoder);
    local_5ea8 = ReadData::GetBDSEph(decoder);
    memcpy(&local_5ed8,&type,0x30);
    type_00.b = (double)uStack_5ed0;
    type_00.a = (double)local_5ed8;
    type_00.c = (double)local_5ec8;
    type_00.alpha = (double)uStack_5ec0;
    type_00.e2 = (double)local_5eb8;
    type_00.e1_2 = dStack_5eb0;
    local_1368 = SPP::solveSPP(SppSolver,&local_5e80,&local_5e88,&local_5e90,&local_5e98,&local_5ea0
                               ,&local_5ea8,type_00);
    if (local_1368 != 0) break;
    SPP::GetResult((SPPResult *)&dt1,SppSolver);
    __dest = local_12e0;
    memcpy(__dest,&dt1,0x12b8);
    local_7198 = (double)result._2440_8_ + result.GPSR;
    std::abs((int)__dest);
    if ((double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da) <= 1e-10 &&
        (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da) != 1e-10) break;
    _flag = local_7198;
  }
  local_71a0 = SatPos::GetPosAndVel(SatposSolver,GPS);
  local_71a8 = SatPos::GetPosAndVel(SatposSolver,BDS);
  local_71b0 = ReadData::GetGPSObs(decoder);
  local_71b8 = ReadData::GetBDSObs(decoder);
  local_71c0 = ReadData::GetGPSEph(decoder);
  local_71c8 = ReadData::GetBDSEph(decoder);
  memcpy(&local_71f8,&type,0x30);
  type_01.b = (double)uStack_71f0;
  type_01.a = (double)local_71f8;
  type_01.c = (double)local_71e8;
  type_01.alpha = (double)uStack_71e0;
  type_01.e2 = (double)local_71d8;
  type_01.e1_2 = dStack_71d0;
  SPP::solveSPV(SppSolver,&local_71a0,&local_71a8,&local_71b0,&local_71b8,&local_71c0,&local_71c8,
                type_01);
  SPP::GetResult(&local_84b0,SppSolver);
  memcpy(local_12e0,&local_84b0,0x12b8);
  if (local_1368 == 0) {
    local_84b8 = SatPos::GetPosAndVel(SatposSolver,GPS);
    local_84c0 = SatPos::GetPosAndVel(SatposSolver,BDS);
    local_84c8 = ReadData::GetGPSObs(decoder);
    local_84d0 = ReadData::GetBDSObs(decoder);
    local_84d8 = ReadData::GetGPSEph(decoder);
    local_84e0 = ReadData::GetBDSEph(decoder);
    local_8518 = type.a;
    dStack_8510 = type.b;
    local_8508 = type.c;
    dStack_8500 = type.alpha;
    local_84f8 = type.e2;
    dStack_84f0 = type.e1_2;
    SPP::solveSPV(SppSolver,&local_84b8,&local_84c0,&local_84c8,&local_84d0,&local_84d8,&local_84e0,
                  type);
    SPP::GetResult(&local_97d0,SppSolver);
    memcpy(local_12e0,&local_97d0,0x12b8);
    local_97d8 = result.UserPositionXYZ.Y;
    local_97e8 = result.ObsTime.SOW;
    dStack_97e0 = result.UserPositionXYZ.X;
    xyz.Y = result.UserPositionXYZ.X;
    xyz.X = result.ObsTime.SOW;
    xyz.Z = result.UserPositionXYZ.Y;
    operator<<((ostream *)&std::cout,xyz);
    memcpy(local_aaa0,local_12e0,0x12b8);
    std::__cxx11::string::string(local_aac0,(string *)path);
    puVar2 = local_aaa0;
    puVar3 = (undefined8 *)&stack0xffffffffffff4208;
    for (lVar1 = 599; lVar1 != 0; lVar1 = lVar1 + -1) {
      *puVar3 = *puVar2;
      puVar2 = puVar2 + (ulong)bVar4 * -2 + 1;
      puVar3 = puVar3 + (ulong)bVar4 * -2 + 1;
    }
    WriteToFile(local_aac0);
    std::__cxx11::string::~string(local_aac0);
    ReadData::ResetObs(decoder);
  }
  return 0;
}

Assistant:

int solve(SatPos &SatposSolver, SPP &SppSolver, ReadData &decoder, ELLIPSOID type, string path) {
    SPPResult result = SppSolver.GetResult();
    if(result.UserRefPositionXYZ.X == -1 && decoder.GetUserPos().H != 0) {
        BLH2XYZ(decoder.GetUserPos(), type, result.UserRefPositionXYZ);
        SppSolver.setRefPos(result.UserRefPositionXYZ);
    }
    // if(SppSolver.re)
    double dt0 = result.GPSR + result.BDSR;
    int count = 0;
    int flag;
    // SATTIME obs;
    while(count < 10)
    {
        flag = SatposSolver.CalculateGPSPos(decoder.GetGPSEph(), decoder.GetGPSObs(), result);
        if(flag != 0)
            break;
        flag = SatposSolver.CalculateSatVel(decoder.GetGPSEph(), GPS, result);
        if(flag != 0)
            break;
        flag = SatposSolver.CalculateBDSPos(decoder.GetBDSEph(), decoder.GetBDSObs(), result);
        if(flag != 0)
            break;
        flag = SatposSolver.CalculateSatVel(decoder.GetBDSEph(), BDS, result);
        if(flag != 0)
            break;
        flag = SppSolver.solveSPP(SatposSolver.GetPosAndVel(GPS), SatposSolver.GetPosAndVel(BDS), 
                            decoder.GetGPSObs(), decoder.GetBDSObs(), 
                            decoder.GetGPSEph(), decoder.GetBDSEph(), type);

        if(flag != 0)
            break;
        result = SppSolver.GetResult();
        double dt1 = result.GPSR + result.BDSR;
        if(abs(dt1 - dt0) < 1e-10)
        {
            break;
        }
        dt0 = dt1;
        count ++;
    } 
    SppSolver.solveSPV(SatposSolver.GetPosAndVel(GPS), SatposSolver.GetPosAndVel(BDS), 
                        decoder.GetGPSObs(), decoder.GetBDSObs(), 
                        decoder.GetGPSEph(), decoder.GetBDSEph(), type);
    result = SppSolver.GetResult();
    if(flag == 0) {
        SppSolver.solveSPV(SatposSolver.GetPosAndVel(GPS), SatposSolver.GetPosAndVel(BDS), 
                            decoder.GetGPSObs(), decoder.GetBDSObs(), 
                            decoder.GetGPSEph(), decoder.GetBDSEph(), type);
        result = SppSolver.GetResult();

        cout << result.UserPositionXYZ;
        WriteToFile(result, path);
        decoder.ResetObs();
    }
    return 0;
}